

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 void *src,size_t srcSize)

{
  BYTE *pBVar1;
  rawSeq *prVar2;
  BYTE *pBVar3;
  U32 minMatch;
  BYTE *pBVar4;
  seqDef *psVar5;
  undefined8 uVar6;
  ZSTD_blockCompressor UNRECOVERED_JUMPTABLE;
  size_t sVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ZSTD_dictMode_e dictMode;
  ulong uVar11;
  BYTE *ip;
  ulong uVar12;
  ulong uVar13;
  BYTE *end;
  uint uVar14;
  
  dictMode = ZSTD_extDict;
  if ((ms->window).dictLimit <= (ms->window).lowLimit) {
    dictMode = (uint)(ms->dictMatchState != (ZSTD_matchState_t *)0x0) * 2;
  }
  minMatch = (ms->cParams).minMatch;
  UNRECOVERED_JUMPTABLE = ZSTD_selectBlockCompressor((ms->cParams).strategy,dictMode);
  uVar12 = rawSeqStore->pos;
  uVar13 = rawSeqStore->size;
  if (uVar13 < uVar12) {
    __assert_fail("rawSeqStore->pos <= rawSeqStore->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x456d,
                  "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  if (rawSeqStore->capacity < uVar13) {
    __assert_fail("rawSeqStore->size <= rawSeqStore->capacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x456e,
                  "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  pBVar1 = (BYTE *)(srcSize + (long)src);
  if (0 < (long)srcSize && uVar12 < uVar13) {
    end = (BYTE *)src;
    do {
      prVar2 = rawSeqStore->seq + uVar12;
      uVar13._0_4_ = prVar2->offset;
      uVar13._4_4_ = prVar2->litLength;
      if ((undefined4)uVar13 == 0) {
        __assert_fail("sequence.offset > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x454a,"rawSeq maybeSplitSequence(rawSeqStore_t *, const U32, const U32)");
      }
      uVar11 = uVar13 >> 0x20;
      uVar14 = rawSeqStore->seq[uVar12].matchLength;
      uVar9 = (uint)((long)pBVar1 - (long)end);
      if (uVar9 < uVar14 + uVar13._4_4_) {
        ZSTD_ldm_skipSequences(rawSeqStore,(long)pBVar1 - (long)end & 0xffffffff,minMatch);
        uVar12 = uVar13 & 0xffffffff;
        if (uVar9 - uVar13._4_4_ < minMatch) {
          uVar12 = 0;
        }
        uVar14 = uVar9 - uVar13._4_4_;
        src = end;
        if ((uVar9 < (uint)uVar13._4_4_ || uVar14 == 0) || (uVar13 = uVar12, uVar14 < minMatch))
        break;
      }
      else {
        rawSeqStore->pos = uVar12 + 1;
      }
      pBVar3 = end + uVar11;
      src = pBVar3 + uVar14;
      if (pBVar1 < src) {
        __assert_fail("ip + sequence.litLength + sequence.matchLength <= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4579,
                      "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                     );
      }
      uVar9 = (int)end - *(int *)&(ms->window).base;
      if (ms->nextToUpdate + 0x400 < uVar9) {
        uVar8 = (uVar9 - ms->nextToUpdate) - 0x400;
        if (0x1ff < uVar8) {
          uVar8 = 0x200;
        }
        ms->nextToUpdate = uVar9 - uVar8;
      }
      ZSTD_ldm_fillFastTables(ms,end);
      sVar7 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,end,uVar11);
      *(undefined8 *)(rep + 1) = *(undefined8 *)rep;
      *rep = (U32)uVar13;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2038,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < seqStore->maxNbLit) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203a,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      pBVar4 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar4 + sVar7) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203b,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (pBVar1 < pBVar3) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203c,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      ip = pBVar3 + -sVar7;
      if (pBVar1 + -0x20 < pBVar3) {
        ZSTD_safecopyLiterals(pBVar4,ip,pBVar3,pBVar1 + -0x20);
LAB_0015bd18:
        seqStore->lit = seqStore->lit + sVar7;
        if (0xffff < sVar7) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        uVar6 = *(undefined8 *)(ip + 8);
        *(undefined8 *)pBVar4 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar4 + 8) = uVar6;
        pBVar3 = seqStore->lit;
        if (0x10 < sVar7) {
          lVar10 = (long)(pBVar3 + 0x10) - (long)(ip + 0x10);
          if (lVar10 < 8) {
            if (-0x10 < lVar10) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
          }
          else if (0xffffffffffffffe0 < lVar10 - 0x10U) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1270,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          uVar6 = *(undefined8 *)(ip + 0x18);
          *(undefined8 *)(pBVar3 + 0x10) = *(undefined8 *)(ip + 0x10);
          *(undefined8 *)(pBVar3 + 0x18) = uVar6;
          if (0x20 < (long)sVar7) {
            lVar10 = 0;
            do {
              uVar6 = *(undefined8 *)(end + lVar10 + (uVar11 - sVar7) + 0x20 + 8);
              pBVar4 = pBVar3 + lVar10 + 0x20;
              *(undefined8 *)pBVar4 = *(undefined8 *)(end + lVar10 + (uVar11 - sVar7) + 0x20);
              *(undefined8 *)(pBVar4 + 8) = uVar6;
              uVar6 = *(undefined8 *)(end + lVar10 + (uVar11 - sVar7) + 0x30 + 8);
              *(undefined8 *)(pBVar4 + 0x10) =
                   *(undefined8 *)(end + lVar10 + (uVar11 - sVar7) + 0x30);
              *(undefined8 *)(pBVar4 + 0x18) = uVar6;
              lVar10 = lVar10 + 0x20;
            } while (pBVar4 + 0x20 < pBVar3 + sVar7);
          }
          goto LAB_0015bd18;
        }
        seqStore->lit = pBVar3 + sVar7;
      }
      psVar5 = seqStore->sequences;
      psVar5->litLength = (U16)sVar7;
      psVar5->offset = (U32)uVar13 + 3;
      if (0xffff < uVar14 - 3) {
        if (seqStore->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2058,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthID = 2;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar5 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
      psVar5->matchLength = (U16)(uVar14 - 3);
      seqStore->sequences = psVar5 + 1;
      uVar12 = rawSeqStore->pos;
      if ((rawSeqStore->size <= uVar12) || (end = (BYTE *)src, pBVar1 <= src)) break;
    } while( true );
  }
  uVar14 = (int)src - *(int *)&(ms->window).base;
  if (ms->nextToUpdate + 0x400 < uVar14) {
    uVar9 = (uVar14 - ms->nextToUpdate) - 0x400;
    if (0x1ff < uVar9) {
      uVar9 = 0x200;
    }
    ms->nextToUpdate = uVar14 - uVar9;
  }
  ZSTD_ldm_fillFastTables(ms,src);
  sVar7 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,(long)pBVar1 - (long)src);
  return sVar7;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the lits */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "calling block compressor on segment of size %u", sequence.litLength);
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength, iend,
                          sequence.offset + ZSTD_REP_MOVE,
                          sequence.matchLength - MINMATCH);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}